

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O3

void __thiscall
cmCommandArgument::cmCommandArgument
          (cmCommandArgument *this,cmCommandArgumentsHelper *args,char *key,
          cmCommandArgumentGroup *group)

{
  _Rb_tree_header *p_Var1;
  iterator __position;
  cmCommandArgument *local_18;
  
  this->_vptr_cmCommandArgument = (_func_int **)&PTR__cmCommandArgument_00679898;
  this->Key = key;
  p_Var1 = &(this->ArgumentsBefore)._M_t._M_impl.super__Rb_tree_header;
  (this->ArgumentsBefore)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ArgumentsBefore)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ArgumentsBefore)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ArgumentsBefore)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->ArgumentsBefore)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Group = group;
  this->WasActive = false;
  this->ArgumentsBeforeEmpty = true;
  this->CurrentIndex = 0;
  if (args != (cmCommandArgumentsHelper *)0x0) {
    cmCommandArgumentsHelper::AddArgument(args,this);
    group = this->Group;
  }
  if ((vector<cmCommandArgument*,std::allocator<cmCommandArgument*>> *)group !=
      (vector<cmCommandArgument*,std::allocator<cmCommandArgument*>> *)0x0) {
    __position._M_current = *(cmCommandArgument ***)((long)group + 8);
    if (__position._M_current == *(cmCommandArgument ***)((long)group + 0x10)) {
      local_18 = this;
      std::vector<cmCommandArgument*,std::allocator<cmCommandArgument*>>::
      _M_realloc_insert<cmCommandArgument*>
                ((vector<cmCommandArgument*,std::allocator<cmCommandArgument*>> *)group,__position,
                 &local_18);
    }
    else {
      *__position._M_current = this;
      *(long *)((long)group + 8) = *(long *)((long)group + 8) + 8;
    }
  }
  return;
}

Assistant:

cmCommandArgument::cmCommandArgument(cmCommandArgumentsHelper* args,
                                     const char* key,
                                     cmCommandArgumentGroup* group)
  : Key(key)
  , Group(group)
  , WasActive(false)
  , ArgumentsBeforeEmpty(true)
  , CurrentIndex(0)
{
  if (args != CM_NULLPTR) {
    args->AddArgument(this);
  }

  if (this->Group != CM_NULLPTR) {
    this->Group->ContainedArguments.push_back(this);
  }
}